

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O3

void __thiscall qpdf::pl::Count::finish(Count *this)

{
  Pipeline *pPVar1;
  
  pPVar1 = (this->super_Pipeline).next_;
  if (pPVar1 != (Pipeline *)0x0) {
    if (this->pass_immediately_to_next == false) {
      (*pPVar1->_vptr_Pipeline[2])(pPVar1,(this->str->_M_dataplus)._M_p,this->str->_M_string_length)
      ;
      pPVar1 = (this->super_Pipeline).next_;
    }
    (*pPVar1->_vptr_Pipeline[3])();
    return;
  }
  return;
}

Assistant:

void
        finish() final
        {
            if (next()) {
                if (!pass_immediately_to_next) {
                    next()->write(reinterpret_cast<unsigned char const*>(str->data()), str->size());
                }
                next()->finish();
            }
        }